

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void __thiscall ImGuiStorage::SetFloat(ImGuiStorage *this,ImGuiID key,float val)

{
  iterator it;
  value_type local_20;
  
  it = LowerBound(&this->Data,key);
  if ((it == (this->Data).Data + (this->Data).Size) || (it->key != key)) {
    local_20.key = key;
    local_20.field_1.val_f = val;
    ImVector<ImGuiStorage::Pair>::insert(&this->Data,it,&local_20);
  }
  else {
    (it->field_1).val_f = val;
  }
  return;
}

Assistant:

void ImGuiStorage::SetFloat(ImGuiID key, float val)
{
    ImVector<Pair>::iterator it = LowerBound(Data, key);
    if (it == Data.end() || it->key != key)
    {
        Data.insert(it, Pair(key, val));
        return;
    }
    it->val_f = val;
}